

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_proxy_isArray(JSContext *ctx,JSValue obj)

{
  JSValue val;
  JSValue obj_00;
  void *pvVar1;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSProxyData *s;
  JSContext *in_stack_ffffffffffffffc8;
  JSValueUnion in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  obj_00.tag = in_RDX;
  obj_00.u.float64 = in_RSI.float64;
  pvVar1 = JS_GetOpaque(obj_00,0x29);
  if (pvVar1 == (void *)0x0) {
    local_4 = 0;
  }
  else if (*(char *)((long)pvVar1 + 0x21) == '\0') {
    val.tag = (int64_t)pvVar1;
    val.u.float64 = in_stack_ffffffffffffffd0.float64;
    local_4 = JS_IsArray(in_stack_ffffffffffffffc8,val);
  }
  else {
    JS_ThrowTypeErrorRevokedProxy((JSContext *)0x132e03);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int js_proxy_isArray(JSContext *ctx, JSValueConst obj)
{
    JSProxyData *s = JS_GetOpaque(obj, JS_CLASS_PROXY);
    if (!s)
        return FALSE;
    if (s->is_revoked) {
        JS_ThrowTypeErrorRevokedProxy(ctx);
        return -1;
    }
    return JS_IsArray(ctx, s->target);
}